

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O1

void __thiscall gvr::TexturedMesh::~TexturedMesh(TexturedMesh *this)

{
  pointer pcVar1;
  
  (this->super_Mesh).super_PointCloud.super_Model._vptr_Model =
       (_func_int **)&PTR__TexturedMesh_001782b8;
  if (this->uv != (float *)0x0) {
    operator_delete__(this->uv);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->basepath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->basepath).field_2) {
    operator_delete(pcVar1);
  }
  Mesh::~Mesh(&this->super_Mesh);
  return;
}

Assistant:

TexturedMesh::~TexturedMesh()
{
  delete [] uv;
}